

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int file_read(void *buf,size_t size,FILE *file)

{
  uint uVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  size_t sVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  FILE *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t n;
  size_t len;
  int file_error;
  int try_count;
  int kMaxTries;
  ulong local_38;
  uint local_2c;
  uint local_28;
  
  local_28 = 0;
  local_2c = 0;
  local_38 = 0;
  while( true ) {
    iVar4 = feof(in_RDX);
    bVar2 = false;
    if ((iVar4 == 0) && (bVar2 = false, local_38 < in_RSI)) {
      bVar2 = (int)local_28 < 5;
    }
    if (!bVar2) break;
    sVar5 = fread((void *)(in_RDI + local_38),1,in_RSI - local_38,in_RDX);
    local_28 = local_28 + 1;
    local_38 = sVar5 + local_38;
    local_2c = ferror(in_RDX);
    if (local_2c != 0) {
      piVar7 = __errno_location();
      if ((*piVar7 != 4) && (piVar7 = __errno_location(), pFVar3 = _stderr, *piVar7 != 0xb)) {
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        fprintf(pFVar3,"Error reading file: %u of %u bytes read, %d: %s\n",local_38 & 0xffffffff,
                in_RSI & 0xffffffff,(ulong)uVar1,pcVar8);
        return 0;
      }
      clearerr(in_RDX);
    }
  }
  iVar4 = feof(in_RDX);
  pFVar3 = _stderr;
  if ((iVar4 == 0) && (local_38 != in_RSI)) {
    piVar7 = __errno_location();
    iVar4 = *piVar7;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    fprintf(pFVar3,"Error reading file: %u of %u bytes read, error: %d, tries: %d, %d: %s\n",
            local_38 & 0xffffffff,in_RSI & 0xffffffff,(ulong)local_2c,(ulong)local_28,iVar4,pcVar8);
  }
  return (uint)(local_38 == in_RSI);
}

Assistant:

static int file_read(void *buf, size_t size, FILE *file) {
  const int kMaxTries = 5;
  int try_count = 0;
  int file_error = 0;
  size_t len = 0;
  while (!feof(file) && len < size && try_count < kMaxTries) {
    const size_t n = fread((uint8_t *)buf + len, 1, size - len, file);
    ++try_count;
    len += n;
    file_error = ferror(file);
    if (file_error) {
      if (errno == EINTR || errno == EAGAIN) {
        clearerr(file);
        continue;
      } else {
        fprintf(stderr, "Error reading file: %u of %u bytes read, %d: %s\n",
                (uint32_t)len, (uint32_t)size, errno, strerror(errno));
        return 0;
      }
    }
  }

  if (!feof(file) && len != size) {
    fprintf(stderr,
            "Error reading file: %u of %u bytes read,"
            " error: %d, tries: %d, %d: %s\n",
            (uint32_t)len, (uint32_t)size, file_error, try_count, errno,
            strerror(errno));
  }
  return len == size;
}